

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sounds.cpp
# Opt level: O1

bool __thiscall CSounds::IsPlaying(CSounds *this,int SetId)

{
  CDataSoundset *pCVar1;
  ISound *pIVar2;
  bool bVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  bVar3 = false;
  if ((-1 < SetId) && (this->m_WaitForSoundJob == false)) {
    if (SetId < g_pData->m_NumSounds) {
      pCVar1 = g_pData->m_aSounds;
      bVar3 = 0 < pCVar1[(uint)SetId].m_NumSounds;
      if (0 < pCVar1[(uint)SetId].m_NumSounds) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          pIVar2 = ((this->super_CComponent).m_pClient)->m_pSound;
          iVar4 = (*(pIVar2->super_IInterface)._vptr_IInterface[0xb])
                            (pIVar2,(ulong)*(uint *)((long)&((pCVar1[(uint)SetId].m_aSounds)->m_Id).
                                                            m_Id + lVar6));
          if ((char)iVar4 != '\0') {
            return true;
          }
          lVar5 = lVar5 + 1;
          lVar6 = lVar6 + 0x10;
          bVar3 = lVar5 < pCVar1[(uint)SetId].m_NumSounds;
        } while (lVar5 < pCVar1[(uint)SetId].m_NumSounds);
      }
    }
    else {
      bVar3 = false;
    }
  }
  return bVar3;
}

Assistant:

bool CSounds::IsPlaying(int SetId)
{
	if(m_WaitForSoundJob || SetId < 0 || SetId >= g_pData->m_NumSounds)
		return false;

	CDataSoundset *pSet = &g_pData->m_aSounds[SetId];
	for(int i = 0; i < pSet->m_NumSounds; i++)
	{
		if(Sound()->IsPlaying(pSet->m_aSounds[i].m_Id))
			return true;
	}
	return false;
}